

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Accuracy::VaryingInterpolationTests::init
          (VaryingInterpolationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  Float<unsigned_int,_8,_23,_127,_3U> FVar1;
  Float<unsigned_int,_8,_23,_127,_3U> FVar2;
  int iVar3;
  char *__s;
  InterpolationCase *pIVar4;
  long lVar5;
  Precision precision;
  Vec3 *pVVar6;
  bool bVar7;
  allocator<char> local_a1;
  TestNode *local_a0;
  Vec3 *local_98;
  string baseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  baseName._M_dataplus._M_p._0_2_ = 0x7000;
  local_a0 = (TestNode *)this;
  FVar1 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&baseName);
  baseName._M_dataplus._M_p._0_2_ = 0xf000;
  FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&baseName);
  iVar3 = CONCAT31((int3)(FVar2.m_value >> 8),init()::coordRanges);
  if (init()::coordRanges == '\0') {
    iVar3 = __cxa_guard_acquire(&init()::coordRanges);
    if (iVar3 != 0) {
      init::coordRanges[0].name = "zero_to_one";
      init::coordRanges[0].minVal.m_data[0] = 0.0;
      init::coordRanges[0].minVal.m_data[1] = 0.0;
      init::coordRanges[0].minVal.m_data[2] = 0.0;
      init::coordRanges[0].maxVal.m_data[0] = 1.0;
      init::coordRanges[0].maxVal.m_data[1] = 1.0;
      init::coordRanges[0].maxVal.m_data[2] = 1.0;
      init::coordRanges[0].minPrecision = PRECISION_LOWP;
      init::coordRanges[1].name = "zero_to_minus_one";
      init::coordRanges[1].minVal.m_data[0] = 0.0;
      init::coordRanges[1].minVal.m_data[1] = 0.0;
      init::coordRanges[1].minVal.m_data[2] = 0.0;
      init::coordRanges[1].maxVal.m_data[0] = -1.0;
      init::coordRanges[1].maxVal.m_data[1] = -1.0;
      init::coordRanges[1].maxVal.m_data[2] = -1.0;
      init::coordRanges[1].minPrecision = PRECISION_LOWP;
      init::coordRanges[2].name = "minus_one_to_one";
      init::coordRanges[2].minVal.m_data[0] = -1.0;
      init::coordRanges[2].minVal.m_data[1] = -1.0;
      init::coordRanges[2].minVal.m_data[2] = -1.0;
      init::coordRanges[2].maxVal.m_data[0] = 1.0;
      init::coordRanges[2].maxVal.m_data[1] = 1.0;
      init::coordRanges[2].maxVal.m_data[2] = 1.0;
      init::coordRanges[2].minPrecision = PRECISION_LOWP;
      init::coordRanges[3].name = "minus_ten_to_ten";
      init::coordRanges[3].minVal.m_data[0] = -10.0;
      init::coordRanges[3].minVal.m_data[1] = -10.0;
      init::coordRanges[3].minVal.m_data[2] = -10.0;
      init::coordRanges[3].maxVal.m_data[0] = 10.0;
      init::coordRanges[3].maxVal.m_data[1] = 10.0;
      init::coordRanges[3].maxVal.m_data[2] = 10.0;
      init::coordRanges[3].minPrecision = PRECISION_MEDIUMP;
      init::coordRanges[4].name = "thousands";
      init::coordRanges[4].minVal.m_data[0] = -5000.0;
      init::coordRanges[4].minVal.m_data[1] = 1000.0;
      init::coordRanges[4].minVal.m_data[2] = 1000.0;
      init::coordRanges[4].maxVal.m_data[0] = 3000.0;
      init::coordRanges[4].maxVal.m_data[1] = -1000.0;
      init::coordRanges[4].maxVal.m_data[2] = 7000.0;
      init::coordRanges[5].name = "full_mediump";
      init::coordRanges[6].name = "full_highp";
      init::coordRanges[6].minVal.m_data[0] = 4.2535296e+37;
      init::coordRanges[6].minVal.m_data[1] = 4.2535296e+37;
      init::coordRanges[6].minVal.m_data[2] = 4.2535296e+37;
      init::coordRanges[6].maxVal.m_data[0] = -4.2535296e+37;
      init::coordRanges[6].maxVal.m_data[1] = -4.2535296e+37;
      init::coordRanges[6].maxVal.m_data[2] = -4.2535296e+37;
      init::coordRanges[6].minPrecision = PRECISION_HIGHP;
      init::coordRanges[4].minPrecision = init::coordRanges[3].minPrecision;
      init::coordRanges[5].minVal.m_data[0] = (float)FVar1;
      init::coordRanges[5].minVal.m_data[1] = (float)FVar1;
      init::coordRanges[5].minVal.m_data[2] = (float)FVar1;
      init::coordRanges[5].maxVal.m_data[0] = (float)FVar2;
      init::coordRanges[5].maxVal.m_data[1] = (float)FVar2;
      init::coordRanges[5].maxVal.m_data[2] = (float)FVar2;
      init::coordRanges[5].minPrecision = init::coordRanges[3].minPrecision;
      iVar3 = __cxa_guard_release(&init()::coordRanges);
    }
  }
  for (precision = PRECISION_LOWP; precision != PRECISION_LAST;
      precision = precision + PRECISION_MEDIUMP) {
    pVVar6 = &init::coordRanges[0].maxVal;
    lVar5 = 7;
    while( true ) {
      bVar7 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar7) break;
      if ((int)*(Precision *)(pVVar6 + 1) <= (int)precision) {
        __s = glu::getPrecisionName(precision);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_a1);
        std::operator+(&local_70,&local_50,"_");
        std::operator+(&baseName,&local_70,*(char **)((long)(pVVar6 + -2) + 4));
        local_98 = pVVar6;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        pIVar4 = (InterpolationCase *)operator_new(0x98);
        pVVar6 = local_98 + -1;
        InterpolationCase::InterpolationCase
                  (pIVar4,(Context *)local_a0[1]._vptr_TestNode,
                   (char *)CONCAT62(baseName._M_dataplus._M_p._2_6_,baseName._M_dataplus._M_p._0_2_)
                   ,"",precision,pVVar6,local_98,false);
        tcu::TestNode::addChild(local_a0,(TestNode *)pIVar4);
        pIVar4 = (InterpolationCase *)operator_new(0x98);
        context = (Context *)local_a0[1]._vptr_TestNode;
        std::operator+(&local_70,&baseName,"_proj");
        InterpolationCase::InterpolationCase
                  (pIVar4,context,local_70._M_dataplus._M_p,"",precision,pVVar6,local_98,true);
        tcu::TestNode::addChild(local_a0,(TestNode *)pIVar4);
        std::__cxx11::string::~string((string *)&local_70);
        iVar3 = std::__cxx11::string::~string((string *)&baseName);
        pVVar6 = local_98;
      }
      pVVar6 = (Vec3 *)((long)(pVVar6 + 3) + 4);
    }
  }
  return iVar3;
}

Assistant:

void VaryingInterpolationTests::init (void)
{
	DE_STATIC_ASSERT(glu::PRECISION_LOWP+1		== glu::PRECISION_MEDIUMP);
	DE_STATIC_ASSERT(glu::PRECISION_MEDIUMP+1	== glu::PRECISION_HIGHP);

	// Exp = Emax-3, Mantissa = 0
	float minF32 = tcu::Float32((0u<<31) | (0xfcu<<23) | 0x0u).asFloat();
	float maxF32 = tcu::Float32((1u<<31) | (0xfcu<<23) | 0x0u).asFloat();
	float minF16 = tcu::Float16((deUint16)((0u<<15) | (0x1cu<<10) | 0x0u)).asFloat();
	float maxF16 = tcu::Float16((deUint16)((1u<<15) | (0x1cu<<10) | 0x0u)).asFloat();

	static const struct
	{
		const char*		name;
		Vec3			minVal;
		Vec3			maxVal;
		glu::Precision	minPrecision;
	} coordRanges[] =
	{
		{ "zero_to_one",		Vec3(  0.0f,   0.0f,   0.0f), Vec3(  1.0f,   1.0f,   1.0f), glu::PRECISION_LOWP		},
		{ "zero_to_minus_one",	Vec3(  0.0f,   0.0f,   0.0f), Vec3( -1.0f,  -1.0f,  -1.0f), glu::PRECISION_LOWP		},
		{ "minus_one_to_one",	Vec3( -1.0f,  -1.0f,  -1.0f), Vec3(  1.0f,   1.0f,   1.0f), glu::PRECISION_LOWP		},
		{ "minus_ten_to_ten",	Vec3(-10.0f, -10.0f, -10.0f), Vec3( 10.0f,  10.0f,  10.0f), glu::PRECISION_MEDIUMP	},
		{ "thousands",			Vec3( -5e3f,   1e3f,   1e3f), Vec3(  3e3f,  -1e3f,   7e3f), glu::PRECISION_MEDIUMP	},
		{ "full_mediump",		Vec3(minF16, minF16, minF16), Vec3(maxF16, maxF16, maxF16), glu::PRECISION_MEDIUMP	},
		{ "full_highp",			Vec3(minF32, minF32, minF32), Vec3(maxF32, maxF32, maxF32), glu::PRECISION_HIGHP	},
	};

	for (int precision = glu::PRECISION_LOWP; precision <= glu::PRECISION_HIGHP; precision++)
	{
		for (int coordNdx = 0; coordNdx < DE_LENGTH_OF_ARRAY(coordRanges); coordNdx++)
		{
			if (precision < (int)coordRanges[coordNdx].minPrecision)
				continue;

			string baseName = string(glu::getPrecisionName((glu::Precision)precision)) + "_" + coordRanges[coordNdx].name;

			addChild(new InterpolationCase(m_context, baseName.c_str(),				"",	(glu::Precision)precision, coordRanges[coordNdx].minVal, coordRanges[coordNdx].maxVal, false));
			addChild(new InterpolationCase(m_context, (baseName + "_proj").c_str(),	"",	(glu::Precision)precision, coordRanges[coordNdx].minVal, coordRanges[coordNdx].maxVal, true));
		}
	}
}